

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

int32_t ures_countArrayItems_63
                  (UResourceBundle *resourceBundle,char *resourceKey,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_f0 [4];
  int32_t result;
  UResourceBundle resData;
  UErrorCode *status_local;
  char *resourceKey_local;
  UResourceBundle *resourceBundle_local;
  
  resData._192_8_ = status;
  ures_initStackObject_63((UResourceBundle *)local_f0);
  if ((resData._192_8_ == 0) || (UVar1 = U_FAILURE(*(UErrorCode *)resData._192_8_), UVar1 != '\0'))
  {
    return 0;
  }
  if (resourceBundle == (UResourceBundle *)0x0) {
    *(undefined4 *)resData._192_8_ = 1;
    return 0;
  }
  ures_getByKey_63(resourceBundle,resourceKey,(UResourceBundle *)local_f0,
                   (UErrorCode *)resData._192_8_);
  if (resData.fResPath != (char *)0x0) {
    iVar2 = res_countArrayItems_63((ResourceData *)&resData.fResPath,resData.fResBuf._60_4_);
    ures_close_63((UResourceBundle *)local_f0);
    return iVar2;
  }
  *(undefined4 *)resData._192_8_ = 2;
  ures_close_63((UResourceBundle *)local_f0);
  return 0;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
ures_countArrayItems(const UResourceBundle* resourceBundle,
                  const char* resourceKey,
                  UErrorCode* status)
{
    UResourceBundle resData;
    ures_initStackObject(&resData);
    if (status==NULL || U_FAILURE(*status)) {
        return 0;
    }
    if(resourceBundle == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    ures_getByKey(resourceBundle, resourceKey, &resData, status);
    
    if(resData.fResData.data != NULL) {
        int32_t result = res_countArrayItems(&resData.fResData, resData.fRes);
        ures_close(&resData);
        return result;
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
        ures_close(&resData);
        return 0;
    }
}